

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

self * __thiscall
stx::
btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
::const_iterator::operator++(const_iterator *this)

{
  const_iterator *this_local;
  
  if (this->currslot + 1 < (uint)(this->currnode->super_node).slotuse) {
    this->currslot = this->currslot + 1;
  }
  else if (this->currnode->nextleaf == (leaf_node *)0x0) {
    this->currslot = (this->currnode->super_node).slotuse;
  }
  else {
    this->currnode = this->currnode->nextleaf;
    this->currslot = 0;
  }
  return this;
}

Assistant:

inline self& operator++()
            {
                if (currslot + 1 < currnode->slotuse) {
                    ++currslot;
                }
                else if (currnode->nextleaf != NULL) {
                    currnode = currnode->nextleaf;
                    currslot = 0;
                }
                else {
                    // this is end()
                    currslot = currnode->slotuse;
                }

                return *this;
            }